

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O3

int decompress_onepass(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  _func_void_j_decompress_ptr **pp_Var1;
  JDIMENSION JVar2;
  uint uVar3;
  jpeg_d_coef_controller *pjVar4;
  jpeg_entropy_decoder *pjVar5;
  jpeg_component_info *pjVar6;
  inverse_DCT_method_ptr p_Var7;
  int iVar8;
  boolean bVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  JDIMENSION JVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  JSAMPARRAY ppJVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  
  pjVar4 = cinfo->coef;
  uVar14 = cinfo->total_iMCU_rows;
  iVar15 = *(int *)((long)&pjVar4[1].start_input_pass + 4);
  iVar8 = *(int *)&pjVar4[1].consume_data;
  if (iVar15 < iVar8) {
    uVar11 = cinfo->MCUs_per_row - 1;
    pp_Var1 = &pjVar4[1].start_output_pass;
    uVar21 = *(uint *)&pjVar4[1].start_input_pass;
    do {
      if (uVar21 <= uVar11) {
        do {
          jzero_far(*pp_Var1,(long)cinfo->blocks_in_MCU << 7);
          pjVar5 = cinfo->entropy;
          if (pjVar5->insufficient_data == 0) {
            cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
          }
          bVar9 = (*pjVar5->decode_mcu)(cinfo,(JBLOCKROW *)pp_Var1);
          if (bVar9 == 0) {
            *(int *)((long)&pjVar4[1].start_input_pass + 4) = iVar15;
            *(uint *)&pjVar4[1].start_input_pass = uVar21;
            return 0;
          }
          if (((cinfo->master->first_iMCU_col <= uVar21) && (uVar21 <= cinfo->master->last_iMCU_col)
              ) && (iVar8 = cinfo->comps_in_scan, 0 < iVar8)) {
            lVar12 = 0;
            iVar16 = 0;
            do {
              pjVar6 = cinfo->cur_comp_info[lVar12];
              if (pjVar6->component_needed == 0) {
                iVar16 = iVar16 + pjVar6->MCU_blocks;
              }
              else {
                iVar10 = pjVar6->MCU_height;
                if (0 < iVar10) {
                  JVar2 = cinfo->master->first_iMCU_col;
                  p_Var7 = cinfo->idct->inverse_DCT[pjVar6->component_index];
                  iVar8 = pjVar6->MCU_sample_width;
                  uVar3 = (&pjVar6->MCU_width)[(ulong)(uVar11 <= uVar21) * 4];
                  iVar18 = pjVar6->DCT_scaled_size;
                  ppJVar19 = output_buf[pjVar6->component_index] + iVar18 * iVar15;
                  uVar20 = 1;
                  if (1 < (int)uVar3) {
                    uVar20 = (ulong)uVar3;
                  }
                  iVar17 = 0;
                  do {
                    if (((cinfo->input_iMCU_row < uVar14 - 1) ||
                        (iVar15 + iVar17 < pjVar6->last_row_height)) && (0 < (int)uVar3)) {
                      uVar22 = 0;
                      JVar13 = (uVar21 - JVar2) * iVar8;
                      do {
                        (*p_Var7)(cinfo,pjVar6,(JCOEFPTR)pp_Var1[(long)iVar16 + uVar22],ppJVar19,
                                  JVar13);
                        iVar18 = pjVar6->DCT_scaled_size;
                        JVar13 = JVar13 + iVar18;
                        uVar22 = uVar22 + 1;
                      } while (uVar20 != uVar22);
                      iVar10 = pjVar6->MCU_height;
                    }
                    iVar16 = iVar16 + pjVar6->MCU_width;
                    ppJVar19 = ppJVar19 + iVar18;
                    iVar17 = iVar17 + 1;
                  } while (iVar17 < iVar10);
                  iVar8 = cinfo->comps_in_scan;
                }
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < iVar8);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 <= uVar11);
        iVar8 = *(int *)&pjVar4[1].consume_data;
      }
      *(undefined4 *)&pjVar4[1].start_input_pass = 0;
      iVar15 = iVar15 + 1;
      uVar21 = 0;
    } while (iVar15 < iVar8);
    uVar14 = cinfo->total_iMCU_rows;
  }
  cinfo->output_iMCU_row = cinfo->output_iMCU_row + 1;
  uVar21 = cinfo->input_iMCU_row + 1;
  cinfo->input_iMCU_row = uVar21;
  if (uVar21 < uVar14) {
    start_iMCU_row(cinfo);
    iVar15 = 3;
  }
  else {
    (*cinfo->inputctl->finish_input_pass)(cinfo);
    iVar15 = 4;
  }
  return iVar15;
}

Assistant:

METHODDEF(int)
decompress_onepass(j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION MCU_col_num;       /* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, ci, xindex, yindex, yoffset, useful_width;
  JSAMPARRAY output_ptr;
  JDIMENSION start_col, output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;

  /* Loop to process as much as one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->MCU_ctr; MCU_col_num <= last_MCU_col;
         MCU_col_num++) {
      /* Try to fetch an MCU.  Entropy decoder expects buffer to be zeroed. */
      jzero_far((void *)coef->MCU_buffer[0],
                (size_t)(cinfo->blocks_in_MCU * sizeof(JBLOCK)));
      if (!cinfo->entropy->insufficient_data)
        cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
      if (!(*cinfo->entropy->decode_mcu) (cinfo, coef->MCU_buffer)) {
        /* Suspension forced; update state counters and exit */
        coef->MCU_vert_offset = yoffset;
        coef->MCU_ctr = MCU_col_num;
        return JPEG_SUSPENDED;
      }

      /* Only perform the IDCT on blocks that are contained within the desired
       * cropping region.
       */
      if (MCU_col_num >= cinfo->master->first_iMCU_col &&
          MCU_col_num <= cinfo->master->last_iMCU_col) {
        /* Determine where data should go in output_buf and do the IDCT thing.
         * We skip dummy blocks at the right and bottom edges (but blkn gets
         * incremented past them!).  Note the inner loop relies on having
         * allocated the MCU_buffer[] blocks sequentially.
         */
        blkn = 0;               /* index of current DCT block within MCU */
        for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
          compptr = cinfo->cur_comp_info[ci];
          /* Don't bother to IDCT an uninteresting component. */
          if (!compptr->component_needed) {
            blkn += compptr->MCU_blocks;
            continue;
          }
          inverse_DCT = cinfo->idct->inverse_DCT[compptr->component_index];
          useful_width = (MCU_col_num < last_MCU_col) ?
                         compptr->MCU_width : compptr->last_col_width;
          output_ptr = output_buf[compptr->component_index] +
                       yoffset * compptr->_DCT_scaled_size;
          start_col = (MCU_col_num - cinfo->master->first_iMCU_col) *
                      compptr->MCU_sample_width;
          for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
            if (cinfo->input_iMCU_row < last_iMCU_row ||
                yoffset + yindex < compptr->last_row_height) {
              output_col = start_col;
              for (xindex = 0; xindex < useful_width; xindex++) {
                (*inverse_DCT) (cinfo, compptr,
                                (JCOEFPTR)coef->MCU_buffer[blkn + xindex],
                                output_ptr, output_col);
                output_col += compptr->_DCT_scaled_size;
              }
            }
            blkn += compptr->MCU_width;
            output_ptr += compptr->_DCT_scaled_size;
          }
        }
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->MCU_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  cinfo->output_iMCU_row++;
  if (++(cinfo->input_iMCU_row) < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    return JPEG_ROW_COMPLETED;
  }
  /* Completed the scan */
  (*cinfo->inputctl->finish_input_pass) (cinfo);
  return JPEG_SCAN_COMPLETED;
}